

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::SonarQubeReporter::writeTestCase(SonarQubeReporter *this,TestCaseNode *testCaseNode)

{
  SectionNode *sectionNode;
  string local_48;
  
  sectionNode = ((testCaseNode->children).
                 super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  writeSection(this,&local_48,sectionNode,
               (((testCaseNode->value).testInfo)->properties & (MayFail|ShouldFail)) != None);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SonarQubeReporter::writeTestCase(TestCaseNode const& testCaseNode) {
        // All test cases have exactly one section - which represents the
        // test case itself. That section may have 0-n nested sections
        assert(testCaseNode.children.size() == 1);
        SectionNode const& rootSection = *testCaseNode.children.front();
        writeSection("", rootSection, testCaseNode.value.testInfo->okToFail());
    }